

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gamma_lut.h
# Opt level: O0

void __thiscall agg::sRGB_lut<float>::sRGB_lut(sRGB_lut<float> *this)

{
  int iVar1;
  double dVar2;
  int local_18;
  int local_14;
  int i_1;
  int i;
  sRGB_lut<float> *this_local;
  
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    dVar2 = sRGB_to_linear((double)local_14 / 255.0);
    this->m_dir_table[local_14] = (float)dVar2;
  }
  for (local_18 = 0; local_18 < 0x10000; local_18 = local_18 + 1) {
    dVar2 = linear_to_sRGB((double)local_18 / 65535.0);
    iVar1 = uround(dVar2 * 255.0);
    this->m_inv_table[local_18] = (int8u)iVar1;
  }
  return;
}

Assistant:

sRGB_lut()
		{
			// Generate lookup tables.
			for (int i = 0; i <= 255; ++i)
			{
				m_dir_table[i] = float(sRGB_to_linear(i / 255.0));
			}
			for (int i = 0; i <= 65535; ++i)
			{
				m_inv_table[i] = uround(255.0 * linear_to_sRGB(i / 65535.0));
			}
		}